

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

Node __thiscall trieste::NodeDef::scope(NodeDef *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  NodeDef *__r;
  Node NVar2;
  
  __r = *(NodeDef **)(in_RSI + 0x48);
  while (__r != (NodeDef *)0x0) {
    std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<trieste::NodeDef,void>
              ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)__r);
    peVar1 = (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
             super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    in_RDX._M_pi = extraout_RDX;
    if ((peVar1->symtab_).super___shared_ptr<trieste::SymtabDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) goto LAB_0013aa54;
    __r = peVar1->parent_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    in_RDX._M_pi = extraout_RDX_00;
  }
  (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0013aa54:
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Node)NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node scope()
    {
      auto p = parent_;

      while (p)
      {
        auto node = p->shared_from_this();

        if (node->symtab_)
          return node;

        p = node->parent_;
      }

      return {};
    }